

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cpp
# Opt level: O2

void __thiscall Block::DeleteRecord(Block *this,float key)

{
  pointer pRVar1;
  uint uVar2;
  long lVar3;
  ostream *poVar4;
  ulong uVar5;
  float fVar6;
  undefined1 auStack_38 [8];
  vector<int,_std::allocator<int>_> deletePos;
  
  lVar3 = (long)(this->records).super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->records).super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
                super__Vector_impl_data._M_start;
  deletePos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = key;
  if (lVar3 != 0) {
    deletePos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    auStack_38 = (undefined1  [8])0x0;
    deletePos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    uVar5 = lVar3 / 0x28 & 0xffffffff;
    while( true ) {
      uVar5 = uVar5 - 1;
      if ((int)(uint)uVar5 < 0) break;
      uVar2 = (uint)uVar5 & 0x7fffffff;
      pRVar1 = (this->records).super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
               super__Vector_impl_data._M_start;
      fVar6 = (float)pRVar1[uVar2].numVotes;
      if ((fVar6 == deletePos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_) &&
         (!NAN(fVar6) &&
          !NAN(deletePos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_))) {
        std::vector<Record,_std::allocator<Record>_>::erase(&this->records,pRVar1 + uVar2);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)auStack_38);
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"[Block::DeleteRecord] error, no record avaliable")
  ;
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void Block::DeleteRecord(float key) {
    if (records.size() == 0) {
        std::cerr << "[Block::DeleteRecord] error, no record avaliable" << std::endl;
        return;
    }
    std::vector<int> deletePos;
    for (int i = records.size()-1; i >= 0; i--) {
        if (records[i].numVotes == key) {
            records.erase(records.begin() + i);
        }
    }
}